

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZThreadPool.cpp
# Opt level: O0

void __thiscall TPZThreadPool::run(TPZThreadPool *this,TPZAutoPointer<TPZReschedulableTask> *task)

{
  int iVar1;
  TPZReschedulableTask *pTVar2;
  TPZThreadPool *this_00;
  packaged_task<void_()> *this_01;
  TPZAutoPointer<TPZReschedulableTask> *in_RSI;
  TPZAutoPointer<TPZTask> tpztask;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff48;
  TPZThreadPool *in_stack_ffffffffffffff50;
  shared_future<void> *in_stack_ffffffffffffff58;
  shared_future<void> local_40 [3];
  TPZAutoPointer<TPZReschedulableTask> *local_10;
  
  local_10 = in_RSI;
  TPZAutoPointer<TPZReschedulableTask>::operator->(in_RSI);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  pTVar2 = TPZAutoPointer<TPZReschedulableTask>::operator->(local_10);
  if ((pTVar2->super_TPZTask).mState == CREATED) {
    this_00 = (TPZThreadPool *)TPZAutoPointer<TPZReschedulableTask>::operator->(local_10);
    this_01 = TPZAutoPointer<std::packaged_task<void_()>_>::operator->
                        (&((TPZTask *)&this_00->mThreads)->mTask);
    std::packaged_task<void_()>::get_future(this_01);
    std::future<void>::share((future<void> *)in_stack_ffffffffffffff48);
    TPZAutoPointer<TPZReschedulableTask>::operator->(local_10);
    std::shared_future<void>::operator=(local_40,in_stack_ffffffffffffff58);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x110bfb7);
    std::future<void>::~future((future<void> *)0x110bfc1);
    iVar1 = threadCount(in_stack_ffffffffffffff50);
    if (iVar1 == 0) {
      in_stack_ffffffffffffff50 =
           (TPZThreadPool *)TPZAutoPointer<TPZReschedulableTask>::operator->(local_10);
      (*((TPZTask *)&in_stack_ffffffffffffff50->mThreads)->_vptr_TPZTask[4])();
      TPZAutoPointer<TPZReschedulableTask>::operator->(local_10);
      std::condition_variable::notify_all();
    }
    else {
      TPZAutoPointer<TPZReschedulableTask>::TPZAutoPointer
                ((TPZAutoPointer<TPZReschedulableTask> *)in_stack_ffffffffffffff50,
                 (TPZAutoPointer<TPZReschedulableTask> *)in_stack_ffffffffffffff48);
      TPZAutoPointerDynamicCast<TPZTask,TPZReschedulableTask>
                ((TPZAutoPointer<TPZReschedulableTask> *)this_01);
      TPZAutoPointer<TPZReschedulableTask>::~TPZAutoPointer
                ((TPZAutoPointer<TPZReschedulableTask> *)in_stack_ffffffffffffff50);
      appendTaskToQueue(this_00,(TPZAutoPointer<TPZTask> *)this_01);
      pTVar2 = TPZAutoPointer<TPZReschedulableTask>::operator->(local_10);
      (pTVar2->super_TPZTask).mState = SCHEDULED;
      TPZAutoPointer<TPZTask>::~TPZAutoPointer((TPZAutoPointer<TPZTask> *)in_stack_ffffffffffffff50)
      ;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

void TPZThreadPool::run(TPZAutoPointer<TPZReschedulableTask> &task) {
    std::unique_lock<std::mutex> lock(task->mStateMutex);
    switch (task->mState) {
        case TPZReschedulableTask::EProcessingState::CREATED:
        {
            task->mFuture = task->mTask->get_future().share();
            if (threadCount() != 0) {
                TPZAutoPointer<TPZTask> tpztask = TPZAutoPointerDynamicCast<TPZTask>(task);
                appendTaskToQueue(tpztask);
                task->mState = TPZReschedulableTask::EProcessingState::SCHEDULED;
            } else {
                task->startInternal();
                task->mCondition.notify_all();
            }
            break;
        }
        case TPZReschedulableTask::EProcessingState::SCHEDULED:
        case TPZReschedulableTask::EProcessingState::STARTED:
        case TPZReschedulableTask::EProcessingState::FINISHED:
            break;
    }
}